

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O3

GCstr * lj_buf_cat2str(lua_State *L,GCstr *s1,GCstr *s2)

{
  uint uVar1;
  uint uVar2;
  uint64_t uVar3;
  GCstr *pGVar4;
  char *str;
  uint sz;
  
  uVar1 = s1->len;
  uVar2 = s2->len;
  sz = uVar2 + uVar1;
  uVar3 = (L->glref).ptr64;
  *(lua_State **)(uVar3 + 0xe0) = L;
  str = *(char **)(uVar3 + 0xd8);
  if ((uint)(*(int *)(uVar3 + 0xd0) - (int)str) < sz) {
    str = lj_buf_need2((SBuf *)(uVar3 + 200),sz);
  }
  memcpy(str,s1 + 1,(ulong)uVar1);
  memcpy(str + uVar1,s2 + 1,(ulong)uVar2);
  pGVar4 = lj_str_new(L,str,(ulong)sz);
  return pGVar4;
}

Assistant:

GCstr *lj_buf_cat2str(lua_State *L, GCstr *s1, GCstr *s2)
{
  MSize len1 = s1->len, len2 = s2->len;
  char *buf = lj_buf_tmp(L, len1 + len2);
  memcpy(buf, strdata(s1), len1);
  memcpy(buf+len1, strdata(s2), len2);
  return lj_str_new(L, buf, len1 + len2);
}